

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O2

int __thiscall PGSStreamReader::readPacket(PGSStreamReader *this,AVPacket *avPacket)

{
  uint8_t **ppuVar1;
  byte bVar2;
  uint8_t uVar3;
  ushort uVar4;
  pointer pPVar5;
  ushort uVar6;
  uint16_t uVar7;
  int iVar8;
  int iVar9;
  int64_t iVar10;
  long lVar11;
  uint8_t *puVar12;
  ostream *poVar13;
  ulong uVar14;
  long lVar15;
  size_t sVar16;
  uint8_t *puVar17;
  ulong uVar18;
  long lVar19;
  pointer __dest;
  uint uVar20;
  bool bVar21;
  double dVar22;
  uint16_t tmpHeight;
  BitStreamReader bitReader;
  
  avPacket->codec = (BaseAbstractStreamReader *)this;
  avPacket->codecID = 0xc;
  avPacket->stream_index = (this->super_AbstractStreamReader).m_streamIndex;
  avPacket->data = (uint8_t *)0x0;
  avPacket->size = 0;
  avPacket->flags = 0;
  avPacket->duration = 0;
  pPVar5 = (this->m_renderedBlocks).
           super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pPVar5 != (this->m_renderedBlocks).
                super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    if (this->m_firstRenderedPacket == true) {
      avPacket->flags = 4;
    }
    this->m_firstRenderedPacket = false;
    puVar17 = pPVar5->data;
    avPacket->data = puVar17;
    uVar20 = pPVar5->len;
    uVar18 = 0x8000;
    if (uVar20 < 0x8000) {
      uVar18 = (ulong)uVar20;
    }
    avPacket->size = (int)uVar18;
    avPacket->pts = pPVar5->pts * 0xe5b0;
    avPacket->dts = pPVar5->dts * 0xe5b0;
    pPVar5->data = puVar17 + uVar18;
    pPVar5->len = uVar20 - (int)uVar18;
    if (uVar20 < 0x8001) {
      std::
      vector<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
      ::erase(&this->m_renderedBlocks,
              (this->m_renderedBlocks).
              super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
              ._M_impl.super__Vector_impl_data._M_start);
      this->m_firstRenderedPacket = true;
      return 0;
    }
    return 0;
  }
  puVar17 = (this->super_AbstractStreamReader).m_curPos;
  if (puVar17 == (uint8_t *)0x0) {
    return 1;
  }
  if (this->m_video_height == 0) {
    intDecodeStream(this,puVar17,(long)(this->super_AbstractStreamReader).m_bufEnd - (long)puVar17);
    if (this->m_video_height == 0) {
      return 1;
    }
    text_subtitles::TextToPGSConverter::enlargeCrop
              (this->m_render,this->m_video_width,this->m_video_height,(uint16_t *)&bitReader,
               &tmpHeight);
    uVar4 = this->m_scaled_width;
    if ((uVar4 == 0) || (uVar4 == (ushort)bitReader.super_BitStream.m_totalBits)) {
      uVar6 = this->m_scaled_height;
      if (uVar6 == 0) {
        this->m_needRescale = false;
      }
      else {
        this->m_needRescale = uVar6 != tmpHeight;
        if (uVar6 != tmpHeight) goto LAB_001d1000;
      }
    }
    else {
      this->m_needRescale = true;
      uVar6 = this->m_scaled_height;
LAB_001d1000:
      uVar20 = (uint)this->m_video_height * (uint)this->m_video_width;
      uVar18 = -(ulong)(uVar20 == 0) | (ulong)uVar20;
      puVar17 = (uint8_t *)operator_new__(uVar18);
      *puVar17 = 0xff;
      memset(puVar17 + 1,0,uVar18 - 1);
      this->m_imgBuffer = puVar17;
      puVar17 = (uint8_t *)operator_new__((ulong)(uVar20 * 4));
      memset(puVar17,0,(ulong)(uVar20 * 4));
      this->m_rgbBuffer = puVar17;
      uVar18 = (ulong)((uint)uVar4 * (uint)uVar6 * 4);
      puVar17 = (uint8_t *)operator_new__(uVar18);
      memset(puVar17,0,uVar18);
      this->m_scaledRgbBuffer = puVar17;
      puVar12 = (uint8_t *)operator_new__((ulong)((uVar4 + 0x10) * (uint)uVar6 + 0x4000));
      this->m_renderedData = puVar12;
      this->m_render->m_imageBuffer = puVar17;
    }
    poVar13 = std::operator<<((ostream *)&std::cout,"Decoding PGS stream (track ");
    poVar13 = (ostream *)
              std::ostream::operator<<(poVar13,(this->super_AbstractStreamReader).m_streamIndex);
    poVar13 = std::operator<<(poVar13,"): ");
    poVar13 = std::operator<<(poVar13," Resolution: ");
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,this->m_video_width);
    poVar13 = std::operator<<(poVar13,':');
    poVar13 = (ostream *)std::ostream::operator<<(poVar13,this->m_video_height);
    std::operator<<(poVar13,"  Frame rate: ");
    poVar13 = std::ostream::_M_insert<double>(this->m_frame_rate);
    std::endl<char,std::char_traits<char>>(poVar13);
    sLastMsg = true;
    dVar22 = this->m_newFps;
    if (((dVar22 != 0.0) || (NAN(dVar22))) &&
       (dVar22 = dVar22 - this->m_frame_rate, uVar18 = -(ulong)(dVar22 < -dVar22),
       0.0001 < (double)(~uVar18 & (ulong)dVar22 | (ulong)-dVar22 & uVar18))) {
      std::operator<<((ostream *)&std::cout,"Change FPS from ");
      poVar13 = std::ostream::_M_insert<double>(this->m_frame_rate);
      std::operator<<(poVar13," to ");
      poVar13 = std::ostream::_M_insert<double>(this->m_newFps);
      poVar13 = std::operator<<(poVar13," for PGS stream #");
      poVar13 = (ostream *)
                std::ostream::operator<<(poVar13,(this->super_AbstractStreamReader).m_streamIndex);
      std::endl<char,std::char_traits<char>>(poVar13);
      sLastMsg = true;
      this->m_scale = this->m_frame_rate / this->m_newFps;
    }
    if (this->m_needRescale == true) {
      poVar13 = std::operator<<((ostream *)&std::cout,"Change PGS resolution from ");
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,this->m_video_width);
      poVar13 = std::operator<<(poVar13,':');
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,this->m_video_height);
      poVar13 = std::operator<<(poVar13," to ");
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,this->m_scaled_width);
      poVar13 = std::operator<<(poVar13,':');
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,this->m_scaled_height);
      poVar13 = std::operator<<(poVar13,". Scaling method: Bilinear interpolation");
      std::endl<char,std::char_traits<char>>(poVar13);
      sLastMsg = true;
    }
  }
  puVar17 = (this->super_AbstractStreamReader).m_curPos;
  if (this->m_state == stAVPacketFragmented) {
    iVar8 = *(int *)&this->m_avFragmentEnd - (int)puVar17;
    iVar9 = 0x8000;
    if (iVar8 < 0x8001) {
      this->m_state = stParsePES;
      iVar9 = iVar8;
    }
    lVar11 = this->m_lastPTS;
    avPacket->pts = lVar11;
    lVar15 = this->m_lastDTS;
    avPacket->dts = lVar15;
    avPacket->data = puVar17;
    bVar21 = this->m_needRescale;
    lVar19 = (long)iVar9;
    if (bVar21 != false) {
      iVar9 = 0;
    }
    avPacket->size = iVar9;
    (this->super_AbstractStreamReader).m_curPos = puVar17 + lVar19;
    this->m_processedSize = this->m_processedSize + lVar19;
    if (bVar21 != true) {
      return 0;
    }
LAB_001d0e47:
    if (lVar15 < 1) {
      lVar15 = 0;
    }
    avPacket->dts = lVar15;
    if (lVar11 < 1) {
      lVar11 = 0;
    }
    avPacket->pts = lVar11;
    return 0;
  }
  sVar16 = (long)(this->super_AbstractStreamReader).m_bufEnd - (long)puVar17;
  if (2 < (long)sVar16) {
    if (*puVar17 == '\0') {
      if ((puVar17[1] != '\0') || (puVar17[2] != '\x01')) goto LAB_001d1124;
      if ((7 < sVar16) && (uVar18 = (ulong)(byte)(puVar17[8] + 9), uVar18 <= sVar16)) {
        bVar2 = puVar17[7];
        if ((char)bVar2 < '\0') {
          uVar14 = get_pts(puVar17 + 9);
          lVar11 = uVar14 * 0xe5b0;
          if (0x1ff000000 < uVar14) {
            lVar11 = uVar14 * 0xe5b0 + -0x1cb6000000000;
          }
          this->m_lastPTS = lVar11;
          this->m_lastDTS = lVar11;
          lVar15 = this->m_maxPTS;
          if (this->m_maxPTS < lVar11) {
            lVar15 = lVar11;
          }
          this->m_maxPTS = lVar15;
          lVar15 = lVar11;
          if (0xbf < bVar2) {
            uVar14 = get_pts(puVar17 + 0xe);
            lVar15 = uVar14 * 0xe5b0 + -0x1cb6000000000;
            if (uVar14 < 0x1ff000001) {
              lVar15 = uVar14 * 0xe5b0;
            }
            this->m_lastDTS = lVar15;
          }
        }
        else {
          lVar11 = this->m_lastPTS;
          lVar15 = this->m_lastDTS;
        }
        (this->super_AbstractStreamReader).m_curPos = puVar17 + uVar18;
        this->m_processedSize = this->m_processedSize + uVar18;
        this->m_state = stParsePGS;
        avPacket->pts = lVar11;
        avPacket->dts = lVar15;
        this->m_isNewFrame = true;
        if (this->m_needRescale != true) {
          return 0;
        }
        if (lVar15 < 1) {
          lVar15 = 0;
        }
        avPacket->dts = lVar15;
        if (lVar11 < 1) {
          lVar11 = 0;
        }
        avPacket->pts = lVar11;
        return 0;
      }
    }
    else {
      if ((*puVar17 != 'P') || (puVar17[1] != 'G')) {
LAB_001d1124:
        avPacket->data = puVar17;
        uVar3 = *puVar17;
        uVar7 = AV_RB16(puVar17 + 1);
        puVar17 = (this->super_AbstractStreamReader).m_curPos;
        puVar12 = (this->super_AbstractStreamReader).m_bufEnd;
        sVar16 = (long)puVar12 - (long)puVar17;
        uVar18 = (ulong)uVar7;
        if ((long)(uVar18 + 3) <= (long)sVar16) {
          puVar17 = puVar17 + 3;
          (this->super_AbstractStreamReader).m_curPos = puVar17;
          bitReader.super_BitStream.m_totalBits = 0;
          bitReader.m_curVal = 0;
          bitReader.m_bitLeft = 0;
          bitReader.super_BitStream.m_buffer = (uint *)0x0;
          bitReader.super_BitStream.m_initBuffer = (uint *)0x0;
          switch(uVar3) {
          case '\x14':
            if (this->m_needRescale == true) {
              readPalette(this,puVar17,puVar17 + uVar18);
            }
            break;
          case '\x15':
            if (this->m_needRescale == true) {
              memset(this->m_imgBuffer,0xff,(ulong)this->m_video_height * (ulong)this->m_video_width
                    );
              memset(this->m_rgbBuffer,0,
                     (ulong)this->m_video_height * (ulong)this->m_video_width * 4);
              memset(this->m_scaledRgbBuffer,0,
                     (ulong)this->m_scaled_height * (ulong)this->m_scaled_width * 4);
              puVar17 = (this->super_AbstractStreamReader).m_curPos;
              iVar9 = readObjectDef(this,puVar17,puVar17 + uVar18);
              if (iVar9 != 0) {
                puVar17 = (this->super_AbstractStreamReader).m_curPos;
                sVar16 = (long)(this->super_AbstractStreamReader).m_bufEnd - (long)puVar17;
                (this->super_AbstractStreamReader).m_tmpBufferLen = sVar16;
                memmove((this->m_tmpBuffer).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,puVar17,sVar16);
                return 1;
              }
              renderTextShow(this,this->m_maxPTS);
            }
            break;
          case '\x16':
            dVar22 = this->m_scale + -1.0;
            uVar14 = -(ulong)(dVar22 < -dVar22);
            if (0.0001 < (double)(~uVar14 & (ulong)dVar22 | (ulong)-dVar22 & uVar14)) {
              iVar9 = calcFpsIndex(this->m_newFps);
              (this->super_AbstractStreamReader).m_curPos[4] = (char)iVar9 << 4;
              puVar17 = (this->super_AbstractStreamReader).m_curPos;
              puVar12 = (this->super_AbstractStreamReader).m_bufEnd;
            }
            BitStreamReader::setBuffer(&bitReader,puVar17,puVar12);
            video_descriptor(this,&bitReader);
            composition_descriptor(this,&bitReader);
            BitStreamReader::skipBits(&bitReader,0x10);
            uVar20 = BitStreamReader::getBits(&bitReader,8);
            uVar20 = uVar20 & 0xff;
            while (bVar21 = uVar20 != 0, uVar20 = uVar20 - 1, bVar21) {
              composition_object(this,&bitReader);
            }
            if ((this->composition_state != csEpochStart) && (this->m_needRescale == true)) {
              renderTextHide(this,this->m_maxPTS);
            }
            break;
          case '\x17':
            BitStreamReader::setBuffer(&bitReader,puVar17,puVar12);
            uVar20 = BitStreamReader::getBits(&bitReader,8);
            uVar20 = uVar20 & 0xff;
            while (bVar21 = uVar20 != 0, uVar20 = uVar20 - 1, bVar21) {
              pgs_window(&bitReader);
            }
          }
          lVar11 = this->m_lastPTS;
          avPacket->pts = lVar11;
          lVar15 = this->m_lastDTS;
          avPacket->dts = lVar15;
          if (this->m_isNewFrame == true) {
            if (this->m_needRescale == false) {
              avPacket->flags = avPacket->flags + 4;
            }
            this->m_isNewFrame = false;
          }
          puVar17 = (this->super_AbstractStreamReader).m_curPos;
          if (0x7ffd < uVar7) {
            this->m_state = stAVPacketFragmented;
            this->m_avFragmentEnd = puVar17 + uVar18;
            uVar18 = 0x7ffd;
          }
          (this->super_AbstractStreamReader).m_curPos = puVar17 + uVar18;
          this->m_processedSize = this->m_processedSize + uVar18 + 3;
          avPacket->size = (int)uVar18 + 3;
          if (this->m_needRescale == true) {
            pPVar5 = (this->m_renderedBlocks).
                     super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if (pPVar5 == (this->m_renderedBlocks).
                          super__Vector_base<PGSStreamReader::PGSRenderedBlock,_std::allocator<PGSStreamReader::PGSRenderedBlock>_>
                          ._M_impl.super__Vector_impl_data._M_finish) {
              if (lVar15 < 1) {
                lVar15 = 0;
              }
              lVar19 = 0;
              if (0 < lVar11) {
                lVar19 = lVar11;
              }
            }
            else {
              lVar15 = pPVar5->dts * 0xe5b0;
              lVar19 = pPVar5->pts * 0xe5b0;
            }
            avPacket->dts = lVar15;
            avPacket->pts = lVar19;
            avPacket->size = 0;
            return 0;
          }
          return 0;
        }
        (this->super_AbstractStreamReader).m_tmpBufferLen = sVar16;
        __dest = (this->m_tmpBuffer).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        goto LAB_001d115f;
      }
      if (9 < sVar16) {
        iVar10 = getTimeValueNano(puVar17 + 2);
        lVar11 = (long)((double)iVar10 * this->m_scale);
        this->m_lastPTS = lVar11;
        puVar17 = (this->super_AbstractStreamReader).m_curPos;
        if (lVar11 < this->m_maxPTS) {
          lVar11 = this->m_maxPTS;
        }
        this->m_maxPTS = lVar11;
        iVar10 = getTimeValueNano(puVar17 + 6);
        lVar15 = (long)((double)iVar10 * this->m_scale);
        lVar11 = this->m_lastPTS;
        if (lVar15 == 0) {
          lVar15 = lVar11;
        }
        this->m_lastDTS = lVar15;
        ppuVar1 = &(this->super_AbstractStreamReader).m_curPos;
        *ppuVar1 = *ppuVar1 + 10;
        this->m_processedSize = this->m_processedSize + 10;
        this->m_state = stParsePGS;
        avPacket->pts = lVar11;
        avPacket->dts = lVar15;
        this->m_isNewFrame = true;
        if (this->m_needRescale != true) {
          return 0;
        }
        goto LAB_001d0e47;
      }
    }
  }
  (this->super_AbstractStreamReader).m_tmpBufferLen = sVar16;
  __dest = (this->m_tmpBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
LAB_001d115f:
  memmove(__dest,puVar17,sVar16);
  return 1;
}

Assistant:

int PGSStreamReader::readPacket(AVPacket& avPacket)
{
    avPacket.size = 0;
    avPacket.codec = this;
    avPacket.codecID = CODEC_S_PGS;
    avPacket.stream_index = m_streamIndex;
    avPacket.data = nullptr;
    avPacket.size = 0;
    avPacket.flags = 0;
    avPacket.duration = 0;

    if (!m_renderedBlocks.empty())
    {  // rendered data block (rescaled PGS). send it.
        if (m_firstRenderedPacket)
            avPacket.flags += AVPacket::FORCE_NEW_FRAME;
        m_firstRenderedPacket = false;
        PGSRenderedBlock& block = m_renderedBlocks[0];
        avPacket.data = block.data;
        avPacket.size = FFMIN(MAX_AV_PACKET_SIZE, block.len);
        avPacket.pts = block.pts * INT_FREQ_TO_TS_FREQ;
        avPacket.dts = block.dts * INT_FREQ_TO_TS_FREQ;
        block.data += avPacket.size;
        block.len -= avPacket.size;
        if (block.len == 0)
        {
            m_renderedBlocks.erase(m_renderedBlocks.begin());
            m_firstRenderedPacket = true;
        }
        return 0;
    }

    if (m_curPos == nullptr)
        return NEED_MORE_DATA;

    if (m_video_height == 0)
    {
        intDecodeStream(m_curPos, m_bufEnd - m_curPos);
        if (m_video_height == 0)
            return NEED_MORE_DATA;

        uint16_t tmpWidth;
        uint16_t tmpHeight;
        m_render->enlargeCrop(m_video_width, m_video_height, &tmpWidth, &tmpHeight);
        m_needRescale =
            (m_scaled_width && m_scaled_width != tmpWidth) || (m_scaled_height && m_scaled_height != tmpHeight);
        if (m_needRescale)
        {
            const unsigned size = m_video_width * m_video_height;
            const unsigned scaled_size = m_scaled_width * m_scaled_height;
            m_imgBuffer = new uint8_t[size]{0xff};
            m_rgbBuffer = new uint8_t[size << 2]{};
            m_scaledRgbBuffer = new uint8_t[scaled_size << 2]{};
            m_renderedData = new uint8_t[(m_scaled_width + 16) * m_scaled_height + 16384];
            m_render->setImageBuffer(m_scaledRgbBuffer);
        }
        LTRACE(LT_INFO, 2,
               "Decoding PGS stream (track " << m_streamIndex << "): "
                                             << " Resolution: " << m_video_width << ':' << m_video_height
                                             << "  Frame rate: " << m_frame_rate);
        if (m_newFps != 0.0 && fabs(m_newFps - m_frame_rate) > 1e-4)
        {
            LTRACE(LT_INFO, 2,
                   "Change FPS from " << m_frame_rate << " to " << m_newFps << " for PGS stream #" << m_streamIndex);
            m_scale = m_frame_rate / m_newFps;
        }
        if (m_needRescale)
            LTRACE(LT_INFO, 2,
                   "Change PGS resolution from " << m_video_width << ':' << m_video_height << " to " << m_scaled_width
                                                 << ':' << m_scaled_height
                                                 << ". Scaling method: Bilinear interpolation");
    }

    if (m_state == State::stAVPacketFragmented)
    {
        int avLen = static_cast<int>(m_avFragmentEnd - m_curPos);
        if (avLen > MAX_AV_PACKET_SIZE)
        {
            avLen = MAX_AV_PACKET_SIZE;
        }
        else
            m_state = State::stParsePES;
        avPacket.pts = m_lastPTS;
        avPacket.dts = m_lastDTS;
        avPacket.data = m_curPos;
        avPacket.size = m_needRescale ? 0 : avLen;
        m_curPos += avLen;
        m_processedSize += avLen;
        if (m_needRescale)
        {
            avPacket.dts = FFMAX(0, avPacket.dts);
            avPacket.pts = FFMAX(0, avPacket.pts);
        }
        return 0;
    }

    if (m_bufEnd - m_curPos < 3)
    {
        m_tmpBufferLen = m_bufEnd - m_curPos;
        memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
        return NEED_MORE_DATA;
    }
    const bool pgStartCode = m_curPos[0] == 'P' && m_curPos[1] == 'G';
    if (pgStartCode)
    {
        if (m_bufEnd - m_curPos < 10)
        {
            m_tmpBufferLen = m_bufEnd - m_curPos;
            memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
            return NEED_MORE_DATA;
        }
        m_lastPTS = static_cast<int64_t>(static_cast<double>(getTimeValueNano(m_curPos + 2)) * m_scale);
        m_maxPTS = FFMAX(m_maxPTS, m_lastPTS);
        m_lastDTS = static_cast<int64_t>(static_cast<double>(getTimeValueNano(m_curPos + 6)) * m_scale);
        if (m_lastDTS == 0)
            m_lastDTS = m_lastPTS;
        m_curPos += 10;
        m_processedSize += 10;
        m_state = State::stParsePGS;
        avPacket.pts = m_lastPTS;
        avPacket.dts = m_lastDTS;
        m_isNewFrame = true;

        if (m_needRescale)
        {
            avPacket.dts = FFMAX(0, avPacket.dts);
            avPacket.pts = FFMAX(0, avPacket.pts);
        }
        return 0;
    }

    const bool pesStartCode = m_curPos[0] == 0 && m_curPos[1] == 0 && m_curPos[2] == 01;

    if (pesStartCode)
    {
        if (m_bufEnd - m_curPos < 8)
        {
            m_tmpBufferLen = m_bufEnd - m_curPos;
            memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
            return NEED_MORE_DATA;
        }
        const auto pesPacket = reinterpret_cast<PESPacket*>(m_curPos);
        const int pesHeaderLen = pesPacket->getHeaderLength();
        // if (m_bufEnd - m_curPos < pesHeaderLen+1) {
        if (m_bufEnd - m_curPos < pesHeaderLen)
        {
            m_tmpBufferLen = m_bufEnd - m_curPos;
            memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
            return NEED_MORE_DATA;
        }
        if (pesPacket->flagsLo & 0x80)
        {  // pts exists
            m_lastDTS = m_lastPTS = getTimeValueNano(pesPacket->getPts());
            m_maxPTS = FFMAX(m_lastPTS, m_maxPTS);
        }
        if ((pesPacket->flagsLo & 0xc0) == 0xc0)  // dts exists
            m_lastDTS = getTimeValueNano(pesPacket->getDts());
        m_curPos += pesHeaderLen;
        m_processedSize += pesHeaderLen;
        m_state = State::stParsePGS;

        avPacket.pts = m_lastPTS;
        avPacket.dts = m_lastDTS;
        m_isNewFrame = true;
        // m_afterPesByte = *m_curPos;
        if (m_needRescale)
        {
            avPacket.dts = FFMAX(0, avPacket.dts);
            avPacket.pts = FFMAX(0, avPacket.pts);
        }
        return 0;
    }

    avPacket.data = m_curPos;
    if (m_bufEnd - m_curPos < 3)
    {
        m_tmpBufferLen = m_bufEnd - m_curPos;
        memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
        return NEED_MORE_DATA;
    }
    const uint8_t segment_type = *m_curPos;
    const auto segment_len = AV_RB16(m_curPos + 1);
    if (m_bufEnd - m_curPos < 3ll + segment_len)
    {
        m_tmpBufferLen = m_bufEnd - m_curPos;
        memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
        return NEED_MORE_DATA;
    }
    m_curPos += 3;
    BitStreamReader bitReader{};
    try
    {
        uint8_t number_of_composition_objects, number_of_windows;
        switch (segment_type)
        {
        case PALETTE_DEF_SEGMENT:
            // pallete definition
            // m_palleteID = m_curPos[0];
            // m_paletteVersion = m_curPos[1];
            if (m_needRescale)
                readPalette(m_curPos, m_curPos + segment_len);
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " palette definition");
            break;
        case OBJECT_DEF_SEGMENT:
            // object definition
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " object definition size " << segment_len
            //	  << " objectID=" << (int)m_curPos[0] << " version=" << (int) m_curPos[2]);
            if (m_needRescale)
            {
                memset(m_imgBuffer, 0xff, static_cast<size_t>(m_video_width) * m_video_height);
                memset(m_rgbBuffer, 0x00, static_cast<size_t>(m_video_width) * m_video_height * 4);
                memset(m_scaledRgbBuffer, 0x00, static_cast<size_t>(m_scaled_width) * m_scaled_height * 4);
                if (readObjectDef(m_curPos, m_curPos + segment_len) == NEED_MORE_DATA)
                {
                    m_tmpBufferLen = m_bufEnd - m_curPos;
                    memmove(m_tmpBuffer.data(), m_curPos, m_tmpBufferLen);
                    return NEED_MORE_DATA;
                }
                renderTextShow(m_maxPTS);
            }
            break;
        case PCS_DEF_SEGMENT:
            // Presentation Composition Segment
            if (fabs(m_scale - 1.0) > 1e-4)
                m_curPos[4] = static_cast<uint8_t>(calcFpsIndex(m_newFps) << 4);
            bitReader.setBuffer(m_curPos, m_bufEnd);
            video_descriptor(bitReader);
            composition_descriptor(bitReader);

            bitReader.skipBits(16);  // palette_update_flag, palette_id_ref
            number_of_composition_objects = bitReader.getBits<uint8_t>(8);
            for (int i = 0; i < number_of_composition_objects; i++)
            {
                composition_object(bitReader);
            }
            if (composition_state != CompositionState::csEpochStart && m_needRescale)
                renderTextHide(m_maxPTS);
            break;
        case WINDOWS_DEF_SEGMENT:
            // Window Definition Segment
            bitReader.setBuffer(m_curPos, m_bufEnd);
            number_of_windows = bitReader.getBits<uint8_t>(8);
            for (int i = 0; i < number_of_windows; i++) pgs_window(bitReader);
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " Window Definition Segment");
            break;
        case 0x18:
            // Interactive Composition Segment
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " Interactive Composition Segment");
        case 0x80:
            // End of Display Set Segment
            // m_end_display_time = get_pts(curPos);
            // curPos += 5;
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " END");
        case 0x81:
        case 0x82:
            // Used by HDMV Text subtitle streams
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " TEXT DATA");
        default:
            // LTRACE(LT_INFO, 2, "PGS #" << m_streamIndex << " unknown type " << (int)segment_type);
            break;
        }
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return NEED_MORE_DATA;
    }
    avPacket.pts = m_lastPTS;
    avPacket.dts = m_lastDTS;
    if (m_isNewFrame)
    {
        if (!m_needRescale)
            avPacket.flags += AVPacket::FORCE_NEW_FRAME;
        m_isNewFrame = false;
    }

    int avLen = segment_len;
    if (avLen > MAX_AV_PACKET_SIZE - 3)
    {
        avLen = MAX_AV_PACKET_SIZE - 3;
        m_state = State::stAVPacketFragmented;
        m_avFragmentEnd = m_curPos + segment_len;
    }
    m_curPos += avLen;
    m_processedSize += 3 + avLen;
    avPacket.size = 3 + avLen;
    if (m_needRescale)
    {
        if (!m_renderedBlocks.empty())
        {
            avPacket.pts = m_renderedBlocks.begin()->pts * INT_FREQ_TO_TS_FREQ;
            avPacket.dts = m_renderedBlocks.begin()->dts * INT_FREQ_TO_TS_FREQ;
        }
        else
        {
            avPacket.dts = FFMAX(0, avPacket.dts);
            avPacket.pts = FFMAX(0, avPacket.pts);
        }
        avPacket.size = 0;  // skip source palette object
    }
    return 0;
}